

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::destroy_cocycle(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                  *this,Simplex_handle *sigma,A_ds_type *a_ds,Simplex_key death_key,
                 Arith_element inv_x,Arith_element charac)

{
  Filtration_value *pFVar1;
  map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
  *this_00;
  Col_type *this_01;
  iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
  iVar2;
  Column *target;
  node_ptr prVar3;
  node_ptr prVar4;
  undefined1 *puVar5;
  _Base_ptr this_02;
  Element w;
  uint uVar6;
  iterator __position;
  iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>_*,_false>
  iVar7;
  pointer pPVar8;
  Col_type *pCVar9;
  mapped_type *pmVar10;
  pointer pPVar11;
  Filtration_value *pFVar12;
  Filtration_value *pFVar13;
  float fVar14;
  Arith_element charac_local;
  iterator row_cell_it;
  Simplex_key death_key_local;
  Field_Zp *local_90;
  undefined1 local_88 [16];
  pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
  result_insert_cam;
  Simplex_handle local_38;
  
  pFVar13 = (Filtration_value *)&sigma->m_ptr->second;
  if (sigma->m_ptr ==
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
       *)0x0) {
    pFVar13 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  iVar2.nodeptr_ =
       (rbtree_node<void_*> *)
       (this->cpx_->filtration_vect_).
       super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start[death_key].m_ptr;
  pFVar12 = (Filtration_value *)&(iVar2.nodeptr_)->left_;
  if (iVar2.nodeptr_ == (rbtree_node<void_*> *)0x0) {
    pFVar12 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  fVar14 = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *)pFVar13)->super_Filtration_simplex_base).filt_ -
           (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *)pFVar12)->super_Filtration_simplex_base).filt_;
  pFVar1 = &(this->interval_length_policy).min_length_;
  charac_local = charac;
  death_key_local = death_key;
  if (*pFVar1 <= fVar14 && fVar14 != *pFVar1) {
    result_insert_cam.first.members_.nodeptr_ =
         (iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
          )(iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
            )iVar2.nodeptr_;
    std::
    vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
    ::
    emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int&>
              ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                *)&this->persistent_pairs_,
               (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                *)&result_insert_cam,sigma,&charac_local);
  }
  this_00 = &this->transverse_idx_;
  __position = std::
               _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>,_std::_Select1st<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
               ::find(&this_00->_M_t,&death_key_local);
  result_insert_cam.first.members_.nodeptr_ =
       (iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
        )(rbtree_node<void_*> *)0x0;
  result_insert_cam.second = false;
  iVar7.nodeptr_ = (list_node<void_*> *)__position._M_node[1]._M_parent;
  row_cell_it.members_.nodeptr_ =
       *(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>_*,_false>
         *)iVar7.nodeptr_;
  local_90 = &this->coeff_field_;
  while( true ) {
    if (row_cell_it.members_.nodeptr_ ==
        (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>_*,_false>
         )iVar7.nodeptr_) break;
    pPVar8 = boost::intrusive::
             bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node<void_*>_*,_Gudhi::persistent_cohomology::cam_h_tag,_1U>
             ::to_value_ptr((node_ptr *)&row_cell_it);
    w = Field_Zp::times_minus(local_90,inv_x,pPVar8->coefficient_);
    if (w == 0) {
      row_cell_it.members_.nodeptr_ =
           *(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>_*,_false>
             *)row_cell_it.members_.nodeptr_;
    }
    else {
      pPVar8 = boost::intrusive::
               bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node<void_*>_*,_Gudhi::persistent_cohomology::cam_h_tag,_1U>
               ::to_value_ptr((node_ptr *)&row_cell_it);
      target = pPVar8->self_col_;
      row_cell_it.members_.nodeptr_ =
           *(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>_*,_false>
             *)row_cell_it.members_.nodeptr_;
      this_01 = &target->col_;
      pCVar9 = this_01;
      while (pCVar9 = *(Col_type **)&(pCVar9->super_type).data_.root_plus_size_.m_header,
            pCVar9 != this_01) {
        prVar3 = *(node_ptr *)(pCVar9 + -1);
        if (prVar3 != (node_ptr)0x0) {
          prVar4 = *(node_ptr *)((long)(pCVar9 + -1) + 8);
          prVar4->parent_ = prVar3;
          prVar3->left_ = prVar4;
          *(node_ptr *)(pCVar9 + -1) = (node_ptr)0x0;
          *(undefined8 *)((long)(pCVar9 + -1) + 8) = 0;
        }
      }
      boost::intrusive::
      bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
      ::erase((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
               *)local_88,(const_iterator *)&this->cam_);
      plus_equal_column(this,target,a_ds,w);
      puVar5 = *(undefined1 **)&(target->col_).super_type.data_.root_plus_size_.m_header.super_node;
      if ((Col_type *)puVar5 == this_01 || puVar5 == (undefined1 *)0x0) {
        (this->ds_repr_).
        super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[target->class_key_] =
             (Persistent_cohomology_column<unsigned_int,_int> *)0x0;
        (target->
        super_set_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)0>_>).
        super_type.super_type.super_rbtree_node<void_*>.parent_ =
             (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
             super_simple_segregated_storage<unsigned_long>.first;
        (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
        super_simple_segregated_storage<unsigned_long>.first = target;
      }
      else {
        boost::intrusive::
        bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
        ::insert_unique((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                         *)local_88,(reference)&this->cam_);
        result_insert_cam.first.members_.nodeptr_ =
             (iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
              )(iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
                )local_88._0_8_;
        result_insert_cam.second = (bool)local_88[8];
        pCVar9 = this_01;
        if (local_88[8] == '\x01') {
          while (pCVar9 = *(Col_type **)&(pCVar9->super_type).data_.root_plus_size_.m_header,
                pCVar9 != this_01) {
            pmVar10 = std::
                      map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
                      ::operator[](this_00,(key_type_conflict *)(pCVar9 + 1));
            boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
            ::push_front(&pmVar10->row_->super_type,(reference)(pCVar9 + -1));
          }
        }
        else {
          uVar6 = target->class_key_;
          pPVar11 = boost::intrusive::
                    bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node<void_*>_*,_boost::intrusive::dft_tag,_3U>
                    ::to_value_ptr((node_ptr *)&result_insert_cam);
          boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
          link<unsigned_int>(&this->dsets_,uVar6,pPVar11->class_key_);
          uVar6 = boost::
                  disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
                  find_set<unsigned_int>(&this->dsets_,target->class_key_);
          pPVar11 = boost::intrusive::
                    bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node<void_*>_*,_boost::intrusive::dft_tag,_3U>
                    ::to_value_ptr((node_ptr *)&result_insert_cam);
          (this->ds_repr_).
          super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar6] = pPVar11;
          pPVar11 = boost::intrusive::
                    bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node<void_*>_*,_boost::intrusive::dft_tag,_3U>
                    ::to_value_ptr((node_ptr *)&result_insert_cam);
          pPVar11->class_key_ = uVar6;
          boost::intrusive::
          list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)0,Gudhi::persistent_cohomology::cam_v_tag,1u>,unsigned_long,false,void>
          ::
          clear_and_dispose<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::destroy_cocycle(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>const&,unsigned_int,int,int)::_lambda(Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>*)_1_>
                    ((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)0,Gudhi::persistent_cohomology::cam_v_tag,1u>,unsigned_long,false,void>
                      *)this_01,(anon_class_8_1_8991fb9c)this);
          (target->
          super_set_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)0>_>).
          super_type.super_type.super_rbtree_node<void_*>.parent_ =
               (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
               super_simple_segregated_storage<unsigned_long>.first;
          (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
          super_simple_segregated_storage<unsigned_long>.first = target;
        }
      }
    }
    iVar7.nodeptr_ = (list_node<void_*> *)__position._M_node[1]._M_parent;
  }
  if (charac_local == local_90->Prime) {
    local_38.m_ptr = sigma->m_ptr;
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_key
              (this->cpx_,&local_38,0xffffffff);
  }
  if (*(int *)&__position._M_node[1]._M_left == charac_local) {
    this_02 = __position._M_node[1]._M_parent;
    if (this_02 != (_Base_ptr)0x0) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
      ::~list_impl((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
                    *)this_02);
    }
    operator_delete(this_02,0x10);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
                        *)this_00,__position);
  }
  else {
    *(int *)&__position._M_node[1]._M_left = *(int *)&__position._M_node[1]._M_left / charac_local;
  }
  return;
}

Assistant:

void destroy_cocycle(Simplex_handle sigma, A_ds_type const& a_ds,
                       Simplex_key death_key, Arith_element inv_x,
                       Arith_element charac) {
    // Create a finite persistent interval for which the interval exists
    if (interval_length_policy(cpx_->simplex(death_key), sigma)) {
      persistent_pairs_.emplace_back(cpx_->simplex(death_key)  // creator
          , sigma                                              // destructor
          , charac);                                           // fields
    }

    auto death_key_row = transverse_idx_.find(death_key);  // Find the beginning of the row.
    std::pair<typename Cam::iterator, bool> result_insert_cam;

    auto row_cell_it = death_key_row->second.row_->begin();

    while (row_cell_it != death_key_row->second.row_->end()) {  // Traverse all cells in
      // the row at index death_key.
      Arith_element w = coeff_field_.times_minus(inv_x, row_cell_it->coefficient_);

      if (w != coeff_field_.additive_identity()) {
        Column * curr_col = row_cell_it->self_col_;
        ++row_cell_it;
        // Disconnect the column from the rows in the CAM.
        for (auto& col_cell : curr_col->col_) {
          col_cell.base_hook_cam_h::unlink();
        }

        // Remove the column from the CAM before modifying its value
        cam_.erase(cam_.iterator_to(*curr_col));
        // Proceed to the reduction of the column
        plus_equal_column(*curr_col, a_ds, w);

        if (curr_col->col_.empty()) {  // If the column is null
          ds_repr_[curr_col->class_key_] = NULL;
          column_pool_.destroy(curr_col);  // delete curr_col;
        } else {
          // Find whether the column obtained is already in the CAM
          result_insert_cam = cam_.insert(*curr_col);
          if (result_insert_cam.second) {  // If it was not in the CAM before: insertion has succeeded
            for (auto& col_cell : curr_col->col_) {
              // re-establish the row links
              transverse_idx_[col_cell.key_].row_->push_front(col_cell);
            }
          } else {  // There is already an identical column in the CAM:
            // merge two disjoint sets.
            dsets_.link(curr_col->class_key_,
                        result_insert_cam.first->class_key_);

            Simplex_key key_tmp = dsets_.find_set(curr_col->class_key_);
            ds_repr_[key_tmp] = &(*(result_insert_cam.first));
            result_insert_cam.first->class_key_ = key_tmp;
            // intrusive containers don't own their elements, we have to release them manually
            curr_col->col_.clear_and_dispose([&](Cell*p){cell_pool_.destroy(p);});
            column_pool_.destroy(curr_col);  // delete curr_col;
          }
        }
      } else {
        ++row_cell_it;
      }  // If w == 0, pass.
    }

    // Because it is a killer simplex, set the data of sigma to null_key().
    if (charac == coeff_field_.characteristic()) {
      cpx_->assign_key(sigma, cpx_->null_key());
    }
    if (death_key_row->second.characteristics_ == charac) {
      delete death_key_row->second.row_;
      transverse_idx_.erase(death_key_row);
    } else {
      death_key_row->second.characteristics_ /= charac;
    }
  }